

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86.cpp
# Opt level: O1

int __thiscall
ncnn::GridSample_x86::forward
          (GridSample_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Mat *src;
  Mat *this_00;
  int *piVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  int *offset_ptr;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  Mat local_f8;
  Option *local_b0;
  size_t local_a8;
  int local_9c;
  Mat local_98;
  undefined1 auStack_4a [2];
  float local_48 [6];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_9c = src->elempack;
  uVar1 = src->c;
  iVar2 = src->dims;
  local_a8 = src->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (float *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8._20_8_ = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  local_b0 = opt;
  if (src[1].elempack == 1) {
    if (&local_98 != src + 1) {
      piVar5 = src[1].refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      local_f8.cstep = 0;
      local_f8.c = 0;
      local_f8.d = 0;
      local_f8.h = 0;
      local_f8.w = 0;
      local_f8.dims = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8._20_8_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.refcount._0_4_ = 0;
      local_f8.data = (float *)0x0;
      local_98.data = src[1].data;
      local_98.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_98.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_98.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_98.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_98.elempack = src[1].elempack;
      local_98.allocator = src[1].allocator;
      uVar11 = src[1].dims;
      uVar12 = src[1].w;
      uVar13 = src[1].h;
      uVar14 = src[1].d;
      local_98.c = src[1].c;
      local_98.cstep = src[1].cstep;
      local_98.dims = uVar11;
      local_98.w = uVar12;
      local_98.h = uVar13;
      local_98.d = uVar14;
    }
  }
  else {
    convert_packing(src + 1,&local_98,1,opt);
  }
  if (iVar2 == 3) {
    uVar4 = local_98.h;
    uVar15 = local_98.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      uVar4 = local_98.c;
      uVar15 = local_98.h;
    }
    opt = (Option *)(ulong)uVar1;
    Mat::create(this_00,uVar15,uVar4,uVar1,local_a8,local_9c,local_b0->blob_allocator);
    iVar19 = -100;
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_005d904b;
    if ((this->super_GridSample).sample_type == 1) {
      Mat::create(&local_f8,uVar15,uVar4,local_a8 * 6,6,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005d904b;
      iVar16 = (this->super_GridSample).padding_mode;
      if (iVar16 == 3) {
        uVar3 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else if (iVar16 == 2) {
        uVar3 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else {
        if (iVar16 != 1) {
          forward();
          goto LAB_005d904b;
        }
        uVar3 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 2) {
      Mat::create(&local_f8,uVar15,uVar4,1,local_a8,1,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005d904b;
      iVar16 = (this->super_GridSample).padding_mode;
      if (iVar16 == 3) {
        uVar3 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else if (iVar16 == 2) {
        uVar3 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
      else {
        if (iVar16 != 1) {
          forward();
          goto LAB_005d904b;
        }
        uVar3 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar3;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar3);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar3);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_f8,uVar15,uVar4,local_a8 * 0x12,0x12,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005d904b;
      iVar16 = (this->super_GridSample).padding_mode;
      if (iVar16 == 3) {
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
      else if (iVar16 == 2) {
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
      else {
        if (iVar16 != 1) {
          forward();
          goto LAB_005d904b;
        }
        uVar4 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar4;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar4);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar4);
        }
      }
    }
  }
  if (iVar2 == 4) {
    uVar4 = local_98.d;
    uVar15 = local_98.w;
    uVar3 = local_98.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      uVar4 = local_98.c;
      uVar15 = local_98.h;
      uVar3 = local_98.d;
    }
    opt = (Option *)(ulong)uVar4;
    Mat::create(this_00,uVar15,uVar3,uVar4,uVar1,local_a8,local_9c,local_b0->blob_allocator);
    iVar19 = -100;
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_005d904b;
    if ((this->super_GridSample).sample_type == 1) {
      Mat::create(&local_f8,uVar15,uVar3,uVar4,local_a8 * 0xb,0xb,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005d904b;
      iVar16 = (this->super_GridSample).padding_mode;
      if (iVar16 == 3) {
        uVar1 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar1;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar1);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar1);
        }
      }
      else if (iVar16 == 2) {
        uVar1 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar1;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar1);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar1);
        }
      }
      else {
        if (iVar16 != 1) {
          forward();
          goto LAB_005d904b;
        }
        uVar1 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar1;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar1);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar1);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 2) {
      Mat::create(&local_f8,uVar15,uVar3,uVar4,1,local_a8,1,local_b0->workspace_allocator);
      if (((float *)local_f8.data == (float *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
      goto LAB_005d904b;
      iVar16 = (this->super_GridSample).padding_mode;
      if (iVar16 == 3) {
        uVar1 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar1;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_f8,uVar1);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_f8,uVar1);
        }
      }
      else if (iVar16 == 2) {
        uVar1 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar1;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_f8,uVar1);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_f8,uVar1);
        }
      }
      else {
        if (iVar16 != 1) {
          forward();
          goto LAB_005d904b;
        }
        uVar1 = (this->super_GridSample).permute_fusion;
        opt = (Option *)(ulong)uVar1;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_f8,uVar1);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_f8,uVar1);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      forward();
      goto LAB_005d904b;
    }
  }
  iVar19 = 0;
  iVar16 = 0;
  if (local_9c != 1) {
    if (local_9c != 4) goto LAB_005d904b;
    if (iVar2 == 3) {
      iVar2 = (this->super_GridSample).sample_type;
      if (iVar2 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p4(src,this_00,&local_f8,opt);
        goto LAB_005d904b;
      }
      if (iVar2 != 2) {
        if (iVar2 == 1) {
          gridsample_2d_bilinear_apply_interpolation_p4(src,this_00,&local_f8,opt);
        }
        goto LAB_005d904b;
      }
    }
    else {
      if (iVar2 != 4) goto LAB_005d904b;
      iVar2 = (this->super_GridSample).sample_type;
      if (iVar2 != 2) {
        if (iVar2 == 1) {
          gridsample_3d_bilinear_apply_interpolation_p4(src,this_00,&local_f8,opt);
        }
        goto LAB_005d904b;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,&local_f8,opt);
    goto LAB_005d904b;
  }
  iVar19 = iVar16;
  if (iVar2 == 3) {
    iVar2 = (this->super_GridSample).sample_type;
    if (iVar2 == 3) {
      iVar2 = this_00->c;
      if (0 < (long)iVar2) {
        iVar16 = this_00->h * this_00->w;
        pvVar6 = src->data;
        sVar7 = src->elemsize;
        sVar8 = src->cstep;
        pvVar20 = this_00->data;
        sVar9 = this_00->elemsize;
        sVar10 = this_00->cstep;
        lVar21 = 0;
        do {
          if (0 < iVar16) {
            lVar17 = sVar7 * sVar8 * lVar21;
            pfVar18 = (float *)(sVar9 * sVar10 * lVar21 + (long)pvVar20);
            iVar19 = 0;
            pfVar23 = (float *)local_f8.data;
            do {
              fVar27 = *pfVar23;
              fVar25 = pfVar23[1];
              fVar29 = fVar27 + 1.0;
              fVar28 = 1.0 - fVar27;
              fVar29 = fVar29 * -6.0 + 3.0 + (3.75 - fVar29 * 0.75) * fVar29 * fVar29;
              fVar28 = (fVar28 * 1.25 + -2.25) * fVar28 * fVar28;
              fVar33 = fVar25 + 1.0;
              fVar32 = 1.0 - fVar25;
              fVar32 = (fVar32 * 1.25 + -2.25) * fVar32 * fVar32;
              fVar27 = (fVar27 * 1.25 + -2.25) * fVar27 * fVar27 + 1.0;
              lVar22 = 2;
              do {
                fVar30 = 0.0;
                fVar31 = 0.0;
                if (-1 < (long)(int)pfVar23[lVar22]) {
                  fVar31 = *(float *)((long)pvVar6 + (long)(int)pfVar23[lVar22] * 4 + lVar17);
                }
                if (-1 < (long)(int)pfVar23[lVar22 + 1]) {
                  fVar30 = *(float *)((long)pvVar6 + (long)(int)pfVar23[lVar22 + 1] * 4 + lVar17);
                }
                fVar24 = 0.0;
                fVar26 = 0.0;
                if (-1 < (long)(int)pfVar23[lVar22 + 2]) {
                  fVar26 = *(float *)((long)pvVar6 + (long)(int)pfVar23[lVar22 + 2] * 4 + lVar17);
                }
                if (-1 < (long)(int)pfVar23[lVar22 + 3]) {
                  fVar24 = *(float *)((long)pvVar6 + (long)(int)pfVar23[lVar22 + 3] * 4 + lVar17);
                }
                *(float *)(auStack_4a + lVar22) =
                     (fVar26 * (fVar28 + 1.0) + fVar31 * fVar29 + fVar30 * fVar27) -
                     fVar24 * (fVar28 + fVar27 + fVar29);
                lVar22 = lVar22 + 4;
              } while (lVar22 != 0x12);
              fVar27 = (fVar25 * 1.25 + -2.25) * fVar25 * fVar25 + 1.0;
              fVar25 = fVar33 * fVar33 * (3.75 - fVar33 * 0.75) + fVar33 * -6.0 + 3.0;
              *pfVar18 = (fVar27 * local_48[1] + fVar25 * local_48[0] +
                         (float)local_48._8_8_ * (fVar32 + 1.0)) -
                         SUB84(local_48._8_8_,4) * (fVar27 + fVar32 + fVar25);
              pfVar18 = pfVar18 + 1;
              pfVar23 = pfVar23 + 0x12;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar16);
          }
          lVar21 = lVar21 + 1;
          iVar19 = 0;
        } while (lVar21 != iVar2);
      }
      goto LAB_005d904b;
    }
    if (iVar2 != 2) {
      if ((iVar2 == 1) && (iVar2 = this_00->c, 0 < (long)iVar2)) {
        iVar16 = this_00->h * this_00->w;
        pvVar6 = src->data;
        sVar7 = src->elemsize;
        sVar8 = src->cstep;
        pvVar20 = this_00->data;
        sVar9 = this_00->elemsize;
        sVar10 = this_00->cstep;
        lVar21 = 0;
        iVar19 = 0;
        do {
          if (0 < iVar16) {
            lVar17 = sVar7 * sVar8 * lVar21;
            lVar22 = 0;
            pfVar23 = (float *)local_f8.data;
            do {
              fVar25 = 0.0;
              fVar27 = 0.0;
              if (-1 < (long)(int)*pfVar23) {
                fVar27 = *(float *)((long)pvVar6 + (long)(int)*pfVar23 * 4 + lVar17);
              }
              if (-1 < (long)(int)pfVar23[1]) {
                fVar25 = *(float *)((long)pvVar6 + (long)(int)pfVar23[1] * 4 + lVar17);
              }
              fVar29 = 0.0;
              fVar28 = 0.0;
              if (-1 < (long)(int)pfVar23[2]) {
                fVar28 = *(float *)((long)pvVar6 + (long)(int)pfVar23[2] * 4 + lVar17);
              }
              if (-1 < (long)(int)pfVar23[3]) {
                fVar29 = *(float *)((long)pvVar6 + (long)(int)pfVar23[3] * 4 + lVar17);
              }
              fVar32 = pfVar23[4];
              fVar27 = fVar32 * fVar25 + fVar27 * (1.0 - fVar32);
              *(float *)((long)pvVar20 + lVar22 * 4) =
                   ((fVar32 * fVar29 + fVar28 * (1.0 - fVar32)) - fVar27) * pfVar23[5] + fVar27;
              pfVar23 = pfVar23 + 6;
              lVar22 = lVar22 + 1;
            } while (iVar16 != (int)lVar22);
          }
          lVar21 = lVar21 + 1;
          pvVar20 = (void *)((long)pvVar20 + sVar9 * sVar10);
        } while (lVar21 != iVar2);
      }
      goto LAB_005d904b;
    }
  }
  else {
    if (iVar2 != 4) goto LAB_005d904b;
    iVar2 = (this->super_GridSample).sample_type;
    if (iVar2 != 2) {
      if (iVar2 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p1(src,this_00,&local_f8,opt);
      }
      goto LAB_005d904b;
    }
  }
  gridsample_nearest_apply_interpolation_p1(src,this_00,&local_f8,opt);
LAB_005d904b:
  piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((float *)local_f8.data != (float *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int GridSample_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}